

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall SslUdpSocket::SslUdpSocket(SslUdpSocket *this)

{
  unique_ptr<SslUdpSocketImpl,_std::default_delete<SslUdpSocketImpl>_> local_18;
  SslUdpSocket *local_10;
  SslUdpSocket *this_local;
  
  local_10 = this;
  UdpSocket::UdpSocket(&this->super_UdpSocket);
  (this->super_UdpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__SslUdpSocket_001b7b90;
  std::make_unique<SslUdpSocketImpl,SslUdpSocket*>((SslUdpSocket **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_UdpSocket).super_BaseSocket.Impl_,&local_18);
  std::unique_ptr<SslUdpSocketImpl,_std::default_delete<SslUdpSocketImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

SslUdpSocket::SslUdpSocket()
{
    Impl_ = make_unique<SslUdpSocketImpl>(this);
}